

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenEM64T.cpp
# Opt level: O0

void __thiscall
Centaurus::LDFARoutineEM64T<wchar_t>::LDFARoutineEM64T
          (LDFARoutineEM64T<wchar_t> *this,LookaheadDFA<wchar_t> *ldfa,Logger *logger)

{
  uint32_t uVar1;
  reference pvVar2;
  socklen_t __len;
  CodeEmitter *exitlabels_00;
  sockaddr *__addr;
  sockaddr *__addr_00;
  sockaddr *extraout_RDX;
  Label LVar3;
  undefined4 in_stack_fffffffffffffd88;
  uint32_t in_stack_fffffffffffffd8c;
  CodeHolder *in_stack_fffffffffffffd90;
  CodeEmitter *this_00;
  undefined4 in_stack_fffffffffffffd98;
  uint32_t in_stack_fffffffffffffd9c;
  uint32_t instId;
  CodeHolder *in_stack_fffffffffffffda0;
  CodeEmitter *this_01;
  Assembler *this_02;
  undefined1 local_240 [28];
  int i_1;
  Label finishlabel;
  uint32_t local_208;
  int i;
  int decision_num;
  vector<asmjit::Label,_std::allocator<asmjit::Label>_> exitlabels;
  Label rejectlabel;
  undefined1 local_1b8 [8];
  X86Assembler as;
  Logger *logger_local;
  LookaheadDFA<wchar_t> *ldfa_local;
  LDFARoutineEM64T<wchar_t> *this_local;
  uint32_t signature;
  
  this->_vptr_LDFARoutineEM64T = (_func_int **)&PTR__LDFARoutineEM64T_0028f7b8;
  this_02 = (Assembler *)&this->m_runtime;
  as.super_Assembler._op5.field_0._mem.field_2 = (anon_union_8_2_78723da6_for_MemData_2)logger;
  asmjit::JitRuntime::JitRuntime((JitRuntime *)in_stack_fffffffffffffd90);
  asmjit::CodeHolder::CodeHolder(in_stack_fffffffffffffd90);
  asmjit::CodeHolder::init
            (&this->m_code,
             (EVP_PKEY_CTX *)&(this->m_runtime).super_HostRuntime.super_Runtime._codeInfo);
  if (as.super_Assembler._op5.field_0._mem.field_2 != 0) {
    asmjit::CodeHolder::setLogger
              (in_stack_fffffffffffffda0,
               (Logger *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
  }
  this_01 = (CodeEmitter *)local_1b8;
  asmjit::X86Assembler::X86Assembler
            ((X86Assembler *)in_stack_fffffffffffffd90,
             (CodeHolder *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88));
  emit_parser_prolog((X86Assembler *)this_01);
  asmjit::CodeEmitter::emit
            (this_01,in_stack_fffffffffffffd9c,(Operand_ *)in_stack_fffffffffffffd90,
             (Operand_ *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88));
  asmjit::Assembler::newLabel(this_02);
  std::vector<asmjit::Label,_std::allocator<asmjit::Label>_>::vector
            ((vector<asmjit::Label,_std::allocator<asmjit::Label>_> *)&i);
  uVar1 = LookaheadDFA<wchar_t>::get_color_num(ldfa);
  instId = uVar1;
  for (local_208 = 0; (int)local_208 < (int)uVar1; local_208 = local_208 + 1) {
    asmjit::Assembler::newLabel(this_02);
    std::vector<asmjit::Label,_std::allocator<asmjit::Label>_>::push_back
              ((vector<asmjit::Label,_std::allocator<asmjit::Label>_> *)&i,
               (value_type *)((long)&finishlabel.super_Operand.super_Operand_.field_0 + 8));
  }
  exitlabels_00 = (CodeEmitter *)&i;
  emit((X86Assembler *)local_1b8,
       (Label *)&exitlabels.super__Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage,ldfa,
       (vector<asmjit::Label,_std::allocator<asmjit::Label>_> *)exitlabels_00);
  asmjit::CodeEmitter::emit
            ((CodeEmitter *)in_stack_fffffffffffffd90,in_stack_fffffffffffffd8c,(Operand_ *)0x180aa8
            );
  LVar3 = asmjit::Assembler::newLabel(this_02);
  __addr = LVar3.super_Operand.super_Operand_.field_0._8_8_;
  for (local_240._20_4_ = 0; __len = (socklen_t)exitlabels_00, (int)local_240._20_4_ < (int)uVar1;
      local_240._20_4_ = local_240._20_4_ + 1) {
    pvVar2 = std::vector<asmjit::Label,_std::allocator<asmjit::Label>_>::operator[]
                       ((vector<asmjit::Label,_std::allocator<asmjit::Label>_> *)&i,
                        (long)(int)local_240._20_4_);
    asmjit::Assembler::bind((Assembler *)local_1b8,(int)pvVar2,__addr_00,__len);
    exitlabels_00 = (CodeEmitter *)local_240;
    asmjit::Imm::Imm((Imm *)exitlabels_00,(long)(local_240._20_4_ + 1));
    this_00 = exitlabels_00;
    asmjit::CodeEmitter::emit
              (this_01,instId,(Operand_ *)exitlabels_00,
               (Operand_ *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88));
    asmjit::CodeEmitter::emit(this_00,in_stack_fffffffffffffd8c,(Operand_ *)0x180b95);
    __addr = extraout_RDX;
  }
  asmjit::Assembler::bind((Assembler *)local_1b8,(int)local_240 + 0x18,__addr,__len);
  emit_parser_epilog((X86Assembler *)local_1b8,
                     (Label *)&exitlabels.
                               super__Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage);
  asmjit::CodeEmitter::finalize((CodeEmitter *)local_1b8);
  std::vector<asmjit::Label,_std::allocator<asmjit::Label>_>::~vector
            ((vector<asmjit::Label,_std::allocator<asmjit::Label>_> *)&i);
  asmjit::X86Assembler::~X86Assembler((X86Assembler *)0x180bff);
  return;
}

Assistant:

LDFARoutineEM64T<TCHAR>::LDFARoutineEM64T(const LookaheadDFA<TCHAR>& ldfa, asmjit::Logger *logger)
{
    m_code.init(m_runtime.getCodeInfo());
    if (logger != NULL)
        m_code.setLogger(logger);

    asmjit::X86Assembler as(&m_code);

    emit_parser_prolog(as);

    as.mov(INPUT_REG, asmjit::X86Mem(asmjit::x86::rsp, ARG1_STACK_OFFSET));

    asmjit::Label rejectlabel = as.newLabel();

    std::vector<asmjit::Label> exitlabels;

    int decision_num = ldfa.get_color_num();
    for (int i = 0; i < decision_num; i++)
    {
        exitlabels.push_back(as.newLabel());
    }

    emit(as, rejectlabel, ldfa, exitlabels);
    as.jmp(rejectlabel);

    asmjit::Label finishlabel = as.newLabel();
    for (int i = 0; i < decision_num; i++)
    {
        as.bind(exitlabels[i]);
        as.mov(INPUT_REG, asmjit::Imm(i + 1));
        as.jmp(finishlabel);
    }

    as.bind(finishlabel);
    emit_parser_epilog(as, rejectlabel);
   
    as.finalize();
}